

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O1

Aig_Obj_t * Aig_ObjCreateCi(Aig_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Obj_t *pAVar4;
  void **ppvVar5;
  int iVar6;
  
  pAVar4 = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p->pMemObjs);
  (pAVar4->field_0).pNext = (Aig_Obj_t *)0x0;
  pAVar4->pFanin0 = (Aig_Obj_t *)0x0;
  pAVar4->pFanin1 = (Aig_Obj_t *)0x0;
  *(undefined8 *)&pAVar4->field_0x18 = 0;
  pAVar4->TravId = 0;
  pAVar4->Id = 0;
  (pAVar4->field_5).pData = (void *)0x0;
  pVVar3 = p->vObjs;
  uVar1 = pVVar3->nSize;
  pAVar4->Id = uVar1;
  uVar2 = pVVar3->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_006005ba;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar2 << 4);
      }
      pVVar3->pArray = ppvVar5;
    }
    pVVar3->nCap = iVar6;
  }
LAB_006005ba:
  iVar6 = pVVar3->nSize;
  pVVar3->nSize = iVar6 + 1;
  pVVar3->pArray[iVar6] = pAVar4;
  *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xfffffffffffffff8 | 2;
  pVVar3 = p->vCis;
  uVar1 = pVVar3->nCap;
  if (pVVar3->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar1 * 2;
      if (iVar6 <= (int)uVar1) goto LAB_0060064c;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar5;
    }
    pVVar3->nCap = iVar6;
  }
LAB_0060064c:
  iVar6 = pVVar3->nSize;
  pVVar3->nSize = iVar6 + 1;
  pVVar3->pArray[iVar6] = pAVar4;
  p->nObjs[2] = p->nObjs[2] + 1;
  return pAVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates primary input.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Obj_t * Aig_ObjCreateCi( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    pObj = Aig_ManFetchMemory( p );
    pObj->Type = AIG_OBJ_CI;
    Vec_PtrPush( p->vCis, pObj );
    p->nObjs[AIG_OBJ_CI]++;
    return pObj;
}